

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cautious_this_capture_cpp_pre17.cpp
# Opt level: O2

int main(void)

{
  anon_class_32_1_66b8a3d0 print;
  Prefixer prefixer;
  allocator<char> local_69;
  string local_68;
  anon_class_32_1_66b8a3d0 local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  Prefixer::Prefixer((Prefixer *)&local_28);
  std::__cxx11::string::string((string *)&local_48,&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Mortals",&local_69);
  anon_class_32_1_66b8a3d0::operator()(&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main() {
  Prefixer prefixer;
  auto print = prefixer.printer();
  print("Mortals");
}